

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_scanLit(int open,ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  char **ppcVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  byte *pbVar5;
  
  pbVar5 = (byte *)ptr;
  if (ptr != end) {
    do {
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar5);
      if ((ulong)bVar1 < 0xe) {
        ppcVar4 = (char **)((long)&switchD_00155678::switchdataD_001d7af4 +
                           (long)(int)(&switchD_00155678::switchdataD_001d7af4)[bVar1]);
        switch(bVar1) {
        case 0:
        case 1:
        case 8:
switchD_00155678_caseD_0:
          *nextTokPtr = (char *)pbVar5;
          return 0;
        default:
          goto switchD_00155678_caseD_2;
        case 5:
          if ((long)end - (long)pbVar5 < 2) {
            return -2;
          }
          iVar2 = (*enc[3].scanners[2])(enc,(char *)pbVar5,ptr,ppcVar4);
          if (iVar2 != 0) goto switchD_00155678_caseD_0;
          pbVar5 = pbVar5 + 2;
          ptr = extraout_RDX_00;
          break;
        case 6:
          if ((long)end - (long)pbVar5 < 3) {
            return -2;
          }
          iVar2 = (*enc[3].scanners[3])(enc,(char *)pbVar5,ptr,ppcVar4);
          if (iVar2 != 0) goto switchD_00155678_caseD_0;
          pbVar5 = pbVar5 + 3;
          ptr = extraout_RDX_01;
          break;
        case 7:
          if ((long)end - (long)pbVar5 < 4) {
            return -2;
          }
          iVar2 = (*enc[3].literalScanners[0])(enc,(char *)pbVar5,ptr,ppcVar4);
          if (iVar2 != 0) goto switchD_00155678_caseD_0;
          pbVar5 = pbVar5 + 4;
          ptr = extraout_RDX;
          break;
        case 0xc:
        case 0xd:
          pbVar5 = pbVar5 + 1;
          if ((uint)bVar1 == open) {
            if (pbVar5 == (byte *)end) {
              return -0x1b;
            }
            *nextTokPtr = (char *)pbVar5;
            uVar3 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar5);
            if (0x1e < uVar3) {
              return 0;
            }
            if ((0x40300e00U >> (uVar3 & 0x1f) & 1) == 0) {
              return 0;
            }
            return 0x1b;
          }
        }
      }
      else {
switchD_00155678_caseD_2:
        pbVar5 = pbVar5 + 1;
      }
    } while (pbVar5 != (byte *)end);
  }
  return -1;
}

Assistant:

static
int PREFIX(scanLit)(int open, const ENCODING *enc,
                    const char *ptr, const char *end,
                    const char **nextTokPtr)
{
  while (ptr != end) {
    int t = BYTE_TYPE(enc, ptr);
    switch (t) {
    INVALID_CASES(ptr, nextTokPtr)
    case BT_QUOT:
    case BT_APOS:
      ptr += MINBPC(enc);
      if (t != open)
        break;
      if (ptr == end)
        return -XML_TOK_LITERAL;
      *nextTokPtr = ptr;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_CR: case BT_LF:
      case BT_GT: case BT_PERCNT: case BT_LSQB:
        return XML_TOK_LITERAL;
      default:
        return XML_TOK_INVALID;
      }
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  return XML_TOK_PARTIAL;
}